

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int exhaustive_mesh_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int range,int step,
              FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  buf_2d *pbVar5;
  buf_2d *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  short sVar12;
  ushort uVar13;
  int iVar14;
  FULLPEL_MV FVar15;
  short sVar16;
  ushort uVar17;
  short sVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  FULLPEL_MV FVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ushort uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  short sVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 auVar35 [16];
  uint sads [4];
  uint8_t *addrs [4];
  uint local_68 [4];
  uint8_t *local_58;
  long alStack_50 [4];
  
  pbVar5 = (ms_params->ms_buffers).ref;
  iVar7 = 4;
  if (1 < step) {
    iVar7 = step;
  }
  pbVar6 = (ms_params->ms_buffers).src;
  uVar8 = (uint)start_mv.row;
  iVar28 = (int)start_mv >> 0x10;
  iVar3 = (ms_params->mv_limits).col_max;
  if (iVar28 < iVar3) {
    iVar3 = iVar28;
  }
  iVar24 = (ms_params->mv_limits).col_min;
  if (iVar28 < iVar24) {
    iVar3 = iVar24;
  }
  uVar4 = (ms_params->mv_limits).row_max;
  if ((int)uVar8 < (int)uVar4) {
    uVar4 = uVar8;
  }
  uVar30 = (ms_params->mv_limits).row_min;
  if ((int)uVar8 < (int)uVar30) {
    uVar4 = uVar30;
  }
  iVar28 = pbVar5->stride;
  sVar31 = (short)uVar4;
  *best_mv = (FULLPEL_MV)(iVar3 << 0x10 | uVar4 & 0xffff);
  iVar24 = (int)sVar31;
  iVar21 = (int)(short)iVar3;
  uVar8 = (*ms_params->sdf)(pbVar6->buf,pbVar6->stride,
                            pbVar5->buf + (pbVar5->stride * iVar24 + iVar21),iVar28);
  bVar2 = (ms_params->mv_cost_params).mv_cost_type;
  if (bVar2 < 4) {
    sVar16 = sVar31 - (ms_params->mv_cost_params).full_ref_mv.row;
    uVar17 = sVar16 * 8;
    sVar12 = (short)iVar3 - (ms_params->mv_cost_params).full_ref_mv.col;
    uVar13 = sVar12 * 8;
    switch(bVar2) {
    case 0:
      uVar30 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar17] +
                *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                        (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar17 != 0) * 8)) +
               (ms_params->mv_cost_params).mvcost[1][(short)uVar13]) *
               (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
      break;
    case 1:
      uVar26 = sVar16 * -8;
      if ((short)(sVar16 * -8) < 0) {
        uVar26 = uVar17;
      }
      uVar17 = sVar12 * -8;
      if ((short)(sVar12 * -8) < 0) {
        uVar17 = uVar13;
      }
      uVar30 = ((uint)uVar17 + (uint)uVar26) * 4;
      break;
    case 2:
      uVar26 = sVar16 * -8;
      if ((short)(sVar16 * -8) < 0) {
        uVar26 = uVar17;
      }
      uVar17 = sVar12 * -8;
      if ((short)(sVar12 * -8) < 0) {
        uVar17 = uVar13;
      }
      uVar30 = ((uint)uVar17 + (uint)uVar26) * 0xf >> 3;
      break;
    case 3:
      uVar26 = sVar16 * -8;
      if ((short)(sVar16 * -8) < 0) {
        uVar26 = uVar17;
      }
      uVar17 = sVar12 * -8;
      if ((short)(sVar12 * -8) < 0) {
        uVar17 = uVar13;
      }
      uVar30 = (uint)uVar17 + (uint)uVar26;
    }
  }
  else {
    uVar30 = 0;
  }
  uVar30 = uVar30 + uVar8;
  iVar9 = -range;
  iVar14 = (ms_params->mv_limits).row_min - iVar24;
  if (iVar14 == iVar9 || SBORROW4(iVar14,iVar9) != iVar14 + range < 0) {
    iVar14 = iVar9;
  }
  iVar19 = (ms_params->mv_limits).col_min - iVar21;
  if (iVar19 == iVar9 || SBORROW4(iVar19,iVar9) != iVar19 + range < 0) {
    iVar19 = iVar9;
  }
  iVar24 = (ms_params->mv_limits).row_max - iVar24;
  if (range <= iVar24) {
    iVar24 = range;
  }
  iVar21 = (ms_params->mv_limits).col_max - iVar21;
  if (range <= iVar21) {
    iVar21 = range;
  }
  if (iVar14 <= iVar24) {
    iVar9 = (iVar3 + iVar19) * 0x10000;
    uVar8 = uVar4 + iVar14;
    do {
      uVar8 = uVar8 & 0xffff;
      if (iVar19 <= iVar21) {
        FVar22 = (FULLPEL_MV)(iVar9 + uVar8);
        sVar12 = (short)(iVar14 + uVar4);
        iVar29 = (iVar3 + iVar19) * 8;
        iVar27 = iVar19;
        iVar33 = iVar9;
        do {
          if (step < 2) {
            if (iVar21 < iVar27 + 3) {
              if (iVar27 < iVar21) {
                iVar25 = 0;
                iVar23 = iVar29;
                iVar32 = iVar33;
                do {
                  uVar10 = (*ms_params->sdf)(pbVar6->buf,pbVar6->stride,
                                             pbVar5->buf +
                                             ((iVar32 >> 0x10) + pbVar5->stride * (int)sVar12),
                                             iVar28);
                  if (uVar10 < uVar30) {
                    bVar2 = (ms_params->mv_cost_params).mv_cost_type;
                    if (bVar2 < 4) {
                      sVar16 = sVar12 - (ms_params->mv_cost_params).full_ref_mv.row;
                      uVar17 = sVar16 * 8;
                      uVar13 = (short)iVar23 + (ms_params->mv_cost_params).full_ref_mv.col * -8;
                      switch(bVar2) {
                      case 0:
                        uVar20 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar17] +
                                  *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                          (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar17 != 0) * 8)
                                          ) + (ms_params->mv_cost_params).mvcost[1][(short)uVar13])
                                 * (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                        break;
                      case 1:
                        uVar26 = sVar16 * -8;
                        if ((short)(sVar16 * -8) < 0) {
                          uVar26 = uVar17;
                        }
                        uVar17 = -uVar13;
                        if (0 < (short)uVar13) {
                          uVar17 = uVar13;
                        }
                        uVar20 = ((uint)uVar17 + (uint)uVar26) * 4;
                        break;
                      case 2:
                        uVar26 = sVar16 * -8;
                        if ((short)(sVar16 * -8) < 0) {
                          uVar26 = uVar17;
                        }
                        uVar17 = -uVar13;
                        if (0 < (short)uVar13) {
                          uVar17 = uVar13;
                        }
                        uVar20 = ((uint)uVar17 + (uint)uVar26) * 0xf >> 3;
                        break;
                      case 3:
                        uVar26 = sVar16 * -8;
                        if ((short)(sVar16 * -8) < 0) {
                          uVar26 = uVar17;
                        }
                        uVar17 = -uVar13;
                        if (0 < (short)uVar13) {
                          uVar17 = uVar13;
                        }
                        uVar20 = (uint)uVar17 + (uint)uVar26;
                      }
                    }
                    else {
                      uVar20 = 0;
                    }
                    if (uVar20 + uVar10 < uVar30) {
                      if (second_best_mv != (FULLPEL_MV *)0x0) {
                        *second_best_mv = *best_mv;
                      }
                      *best_mv = (FULLPEL_MV)(uVar8 + iVar32);
                      uVar30 = uVar20 + uVar10;
                    }
                  }
                  iVar25 = iVar25 + 1;
                  iVar32 = iVar32 + 0x10000;
                  iVar23 = iVar23 + 8;
                } while (iVar25 < iVar21 - iVar27);
              }
            }
            else {
              iVar32 = pbVar5->stride * (int)(short)((short)iVar14 + sVar31);
              puVar1 = pbVar5->buf;
              auVar34._8_4_ = (int)puVar1;
              auVar34._0_8_ = puVar1;
              auVar34._12_4_ = (int)((ulong)puVar1 >> 0x20);
              lVar11 = 0;
              iVar23 = 0;
              iVar25 = 1;
              do {
                iVar36 = ((iVar3 + iVar27 + iVar23) * 0x10000 >> 0x10) + iVar32;
                auVar35._4_4_ = ((iVar3 + iVar27 + iVar25) * 0x10000 >> 0x10) + iVar32;
                auVar35._8_4_ = auVar35._4_4_;
                auVar35._12_4_ = -(uint)(auVar35._4_4_ < 0);
                (&local_58)[lVar11] = puVar1 + CONCAT44(-(uint)(iVar36 < 0),iVar36);
                alStack_50[lVar11] = auVar35._8_8_ + auVar34._8_8_;
                lVar11 = lVar11 + 2;
                iVar23 = iVar23 + 2;
                iVar25 = iVar25 + 2;
              } while (lVar11 != 4);
              (*ms_params->sdx4df)(pbVar6->buf,pbVar6->stride,&local_58,iVar28,local_68);
              lVar11 = 0;
              iVar32 = iVar29;
              FVar15 = FVar22;
              do {
                if (local_68[lVar11] < uVar30) {
                  bVar2 = (ms_params->mv_cost_params).mv_cost_type;
                  if (bVar2 < 4) {
                    sVar16 = sVar12 - (ms_params->mv_cost_params).full_ref_mv.row;
                    uVar17 = sVar16 * 8;
                    uVar13 = (short)iVar32 + (ms_params->mv_cost_params).full_ref_mv.col * -8;
                    switch(bVar2) {
                    case 0:
                      uVar10 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar17] +
                                *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                        (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar17 != 0) * 8))
                               + (ms_params->mv_cost_params).mvcost[1][(short)uVar13]) *
                               (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                      break;
                    case 1:
                      uVar26 = sVar16 * -8;
                      if ((short)(sVar16 * -8) < 0) {
                        uVar26 = uVar17;
                      }
                      uVar17 = -uVar13;
                      if (0 < (short)uVar13) {
                        uVar17 = uVar13;
                      }
                      uVar10 = ((uint)uVar17 + (uint)uVar26) * 4;
                      break;
                    case 2:
                      uVar26 = sVar16 * -8;
                      if ((short)(sVar16 * -8) < 0) {
                        uVar26 = uVar17;
                      }
                      uVar17 = -uVar13;
                      if (0 < (short)uVar13) {
                        uVar17 = uVar13;
                      }
                      uVar10 = ((uint)uVar17 + (uint)uVar26) * 0xf >> 3;
                      break;
                    case 3:
                      uVar26 = sVar16 * -8;
                      if ((short)(sVar16 * -8) < 0) {
                        uVar26 = uVar17;
                      }
                      uVar17 = -uVar13;
                      if (0 < (short)uVar13) {
                        uVar17 = uVar13;
                      }
                      uVar10 = (uint)uVar17 + (uint)uVar26;
                    }
                  }
                  else {
                    uVar10 = 0;
                  }
                  uVar10 = uVar10 + local_68[lVar11];
                  if (uVar10 < uVar30) {
                    if (second_best_mv != (FULLPEL_MV *)0x0) {
                      *second_best_mv = *best_mv;
                    }
                    *best_mv = FVar15;
                    uVar30 = uVar10;
                  }
                }
                lVar11 = lVar11 + 1;
                FVar15 = (FULLPEL_MV)((int)FVar15 + 0x10000);
                iVar32 = iVar32 + 8;
              } while (lVar11 != 4);
            }
          }
          else {
            sVar16 = (short)(iVar27 + iVar3);
            uVar10 = (*ms_params->sdf)(pbVar6->buf,pbVar6->stride,
                                       pbVar5->buf + ((int)sVar16 + pbVar5->stride * (int)sVar12),
                                       iVar28);
            if (uVar10 < uVar30) {
              bVar2 = (ms_params->mv_cost_params).mv_cost_type;
              if (bVar2 < 4) {
                sVar18 = sVar12 - (ms_params->mv_cost_params).full_ref_mv.row;
                sVar16 = sVar16 - (ms_params->mv_cost_params).full_ref_mv.col;
                uVar17 = sVar18 * 8;
                uVar13 = sVar16 * 8;
                switch(bVar2) {
                case 0:
                  uVar20 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar17] +
                            *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                    (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar17 != 0) * 8)) +
                           (ms_params->mv_cost_params).mvcost[1][(short)uVar13]) *
                           (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                  break;
                case 1:
                  uVar26 = sVar18 * -8;
                  if ((short)(sVar18 * -8) < 0) {
                    uVar26 = uVar17;
                  }
                  uVar17 = sVar16 * -8;
                  if ((short)(sVar16 * -8) < 0) {
                    uVar17 = uVar13;
                  }
                  uVar20 = ((uint)uVar17 + (uint)uVar26) * 4;
                  break;
                case 2:
                  uVar26 = sVar18 * -8;
                  if ((short)(sVar18 * -8) < 0) {
                    uVar26 = uVar17;
                  }
                  uVar17 = sVar16 * -8;
                  if ((short)(sVar16 * -8) < 0) {
                    uVar17 = uVar13;
                  }
                  uVar20 = ((uint)uVar17 + (uint)uVar26) * 0xf >> 3;
                  break;
                case 3:
                  uVar26 = sVar18 * -8;
                  if ((short)(sVar18 * -8) < 0) {
                    uVar26 = uVar17;
                  }
                  uVar17 = sVar16 * -8;
                  if ((short)(sVar16 * -8) < 0) {
                    uVar17 = uVar13;
                  }
                  uVar20 = (uint)uVar17 + (uint)uVar26;
                }
              }
              else {
                uVar20 = 0;
              }
              if (uVar20 + uVar10 < uVar30) {
                if (second_best_mv != (FULLPEL_MV *)0x0) {
                  *second_best_mv = *best_mv;
                }
                *best_mv = (FULLPEL_MV)((iVar27 + iVar3) * 0x10000 + (iVar14 + uVar4 & 0xffff));
                uVar30 = uVar20 + uVar10;
              }
            }
          }
          iVar27 = iVar27 + iVar7;
          FVar22 = (FULLPEL_MV)((int)FVar22 + iVar7 * 0x10000);
          iVar29 = iVar29 + iVar7 * 8;
          iVar33 = iVar33 + iVar7 * 0x10000;
        } while (iVar27 <= iVar21);
      }
      iVar14 = iVar14 + step;
      uVar8 = uVar8 + step;
    } while (iVar14 <= iVar24);
  }
  return uVar30;
}

Assistant:

static int exhaustive_mesh_search(FULLPEL_MV start_mv,
                                  const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                                  const int range, const int step,
                                  FULLPEL_MV *best_mv,
                                  FULLPEL_MV *second_best_mv) {
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const int ref_stride = ref->stride;
  unsigned int best_sad = INT_MAX;
  int r, c, i;
  int start_col, end_col, start_row, end_row;
  const int col_step = (step > 1) ? step : 4;

  assert(step >= 1);

  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  *best_mv = start_mv;
  best_sad = get_mvpred_sad(ms_params, src, get_buf_from_fullmv(ref, &start_mv),
                            ref_stride);
  best_sad += mvsad_err_cost_(&start_mv, mv_cost_params);
  start_row = AOMMAX(-range, ms_params->mv_limits.row_min - start_mv.row);
  start_col = AOMMAX(-range, ms_params->mv_limits.col_min - start_mv.col);
  end_row = AOMMIN(range, ms_params->mv_limits.row_max - start_mv.row);
  end_col = AOMMIN(range, ms_params->mv_limits.col_max - start_mv.col);

  for (r = start_row; r <= end_row; r += step) {
    for (c = start_col; c <= end_col; c += col_step) {
      // Step > 1 means we are not checking every location in this pass.
      if (step > 1) {
        const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c };
        unsigned int sad = get_mvpred_sad(
            ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
        update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                           /*raw_best_sad=*/NULL, best_mv, second_best_mv);
      } else {
        // 4 sads in a single call if we are checking every location
        if (c + 3 <= end_col) {
          unsigned int sads[4];
          const uint8_t *addrs[4];
          for (i = 0; i < 4; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            addrs[i] = get_buf_from_fullmv(ref, &mv);
          }

          ms_params->sdx4df(src->buf, src->stride, addrs, ref_stride, sads);

          for (i = 0; i < 4; ++i) {
            if (sads[i] < best_sad) {
              const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
              update_mvs_and_sad(sads[i], &mv, mv_cost_params, &best_sad,
                                 /*raw_best_sad=*/NULL, best_mv,
                                 second_best_mv);
            }
          }
        } else {
          for (i = 0; i < end_col - c; ++i) {
            const FULLPEL_MV mv = { start_mv.row + r, start_mv.col + c + i };
            unsigned int sad = get_mvpred_sad(
                ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
            update_mvs_and_sad(sad, &mv, mv_cost_params, &best_sad,
                               /*raw_best_sad=*/NULL, best_mv, second_best_mv);
          }
        }
      }
    }
  }

  return best_sad;
}